

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int inherit_config_flag(lys_node *node,int flags,int clear)

{
  ushort uVar1;
  ly_ctx *ctx;
  LYS_NODE LVar2;
  int iVar3;
  
  if (node != (lys_node *)0x0) {
    if (3 < (uint)flags) {
      __assert_fail("!(flags ^ (flags & LYS_CONFIG_MASK))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0x125c,"int inherit_config_flag(struct lys_node *, int, int)");
    }
    ctx = node->module->ctx;
    for (; (lys_node_leaf *)node != (lys_node_leaf *)0x0; node = ((lys_node_leaf *)node)->next) {
      uVar1 = ((lys_node_leaf *)node)->flags;
      if (clear == 0) {
        if ((uVar1 & 4) == 0) {
          LVar2 = ((lys_node_leaf *)node)->nodetype;
          if ((((LVar2 & (LYS_USES|LYS_GROUPING)) != LYS_UNKNOWN) ||
              (((lys_node_leaf *)node)->flags = uVar1 & 0xfff8 | (ushort)flags, (flags & 1U) == 0))
             || (LVar2 != LYS_LIST)) goto LAB_001153f8;
          if (((lys_node_leaf *)node)->padding[2] == '\0') {
            ly_vlog(ctx,LYE_MISSCHILDSTMT,LY_VLOG_LYS,node,"key","list");
            return -1;
          }
          goto LAB_0011543f;
        }
        if ((1 < (uint)flags) && ((uVar1 & 1) != 0)) {
          ly_vlog(ctx,LYE_INARG,LY_VLOG_LYS,node,"true","config");
          ly_vlog(ctx,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                  "State nodes cannot have configuration nodes as children.");
          return -1;
        }
      }
      else {
        ((lys_node_leaf *)node)->flags = uVar1 & 0xfff8;
        LVar2 = ((lys_node_leaf *)node)->nodetype;
LAB_001153f8:
        if ((LVar2 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
LAB_0011543f:
          iVar3 = inherit_config_flag((lys_node *)((lys_node_leaf *)node)->backlinks,flags,clear);
        }
        else {
          if ((LVar2 & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) goto LAB_00115452;
          iVar3 = check_leafref_config((lys_node_leaf *)node,&((lys_node_leaf *)node)->type);
        }
        if (iVar3 != 0) {
          return -1;
        }
      }
LAB_00115452:
    }
  }
  return 0;
}

Assistant:

int
inherit_config_flag(struct lys_node *node, int flags, int clear)
{
    struct lys_node_leaf *leaf;
    struct ly_ctx *ctx;

    if (!node) {
        return 0;
    }

    assert(!(flags ^ (flags & LYS_CONFIG_MASK)));
    ctx = node->module->ctx;

    LY_TREE_FOR(node, node) {
        if (clear) {
            node->flags &= ~LYS_CONFIG_MASK;
            node->flags &= ~LYS_CONFIG_SET;
        } else {
            if (node->flags & LYS_CONFIG_SET) {
                /* skip nodes with an explicit config value */
                if ((flags & LYS_CONFIG_R) && (node->flags & LYS_CONFIG_W)) {
                    LOGVAL(ctx, LYE_INARG, LY_VLOG_LYS, node, "true", "config");
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
                    return -1;
                }
                continue;
            }

            if (!(node->nodetype & (LYS_USES | LYS_GROUPING))) {
                node->flags = (node->flags & ~LYS_CONFIG_MASK) | flags;
                /* check that configuration lists have keys */
                if ((node->nodetype == LYS_LIST) && (node->flags & LYS_CONFIG_W)
                        && !((struct lys_node_list *)node)->keys_size) {
                    LOGVAL(ctx, LYE_MISSCHILDSTMT, LY_VLOG_LYS, node, "key", "list");
                    return -1;
                }
            }
        }
        if (!(node->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA))) {
            if (inherit_config_flag(node->child, flags, clear)) {
                return -1;
            }
        } else if (node->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
            leaf = (struct lys_node_leaf *)node;
            if (check_leafref_config(leaf, &leaf->type)) {
                return -1;
            }
        }
    }

    return 0;
}